

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  long lVar1;
  int *piVar2;
  sqlite3 *psVar3;
  uint uVar4;
  int iVar5;
  Parse *pParse_00;
  long in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  Expr *pParent;
  Expr *pNew;
  Expr *pDup;
  Expr *pE;
  ExprList_item *pItem;
  int moreToDo;
  sqlite3 *db;
  ExprList *pEList;
  ExprList *pOrderBy;
  int i;
  int iCol;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  sqlite3 *in_stack_ffffffffffffff90;
  sqlite3 *in_stack_ffffffffffffff98;
  sqlite3 *db_00;
  Select *pSelect_00;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  int local_24;
  long local_20;
  int local_10;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 1;
  piVar2 = *(int **)(in_RSI + 0x48);
  if (piVar2 == (int *)0x0) {
    local_10 = 0;
  }
  else {
    psVar3 = in_RDI->db;
    if (psVar3->aLimit[2] < *piVar2) {
      sqlite3ErrorMsg(in_RDI,"too many terms in ORDER BY clause");
      local_10 = 1;
    }
    else {
      for (local_24 = 0; local_24 < *piVar2; local_24 = local_24 + 1) {
        *(ushort *)((long)piVar2 + (long)local_24 * 0x18 + 0x19) =
             *(ushort *)((long)piVar2 + (long)local_24 * 0x18 + 0x19) & 0xfffb;
      }
      *(undefined8 *)(in_RSI + 0x58) = 0;
      for (local_20 = in_RSI; *(long *)(local_20 + 0x50) != 0; local_20 = *(long *)(local_20 + 0x50)
          ) {
        *(long *)(*(long *)(local_20 + 0x50) + 0x58) = local_20;
      }
      while( true ) {
        uVar4 = in_stack_ffffffffffffff8c & 0xffffff;
        if (local_20 != 0) {
          uVar4 = CONCAT13(iVar6 != 0,(int3)in_stack_ffffffffffffff8c);
        }
        in_stack_ffffffffffffff8c = uVar4;
        if ((char)(in_stack_ffffffffffffff8c >> 0x18) == '\0') break;
        iVar6 = 0;
        pSelect_00 = (Select *)(piVar2 + 2);
        for (local_24 = 0; local_24 < *piVar2; local_24 = local_24 + 1) {
          db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
          if (((*(ushort *)((long)&pSelect_00->selId + 1) >> 2 & 1) == 0) &&
             (pParse_00 = (Parse *)sqlite3ExprSkipCollateAndLikely(*(Expr **)pSelect_00),
             pParse_00 != (Parse *)0x0)) {
            iVar5 = sqlite3ExprIsInteger((Expr *)pSelect_00,(int *)pParse_00,(Parse *)db_00);
            if (iVar5 != 0) {
              resolveOutOfRangeError
                        ((Parse *)db_00,(char *)in_stack_ffffffffffffff98,
                         (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                         (int)in_stack_ffffffffffffff90,
                         (Expr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
              local_10 = 1;
              goto LAB_001dd8ee;
            }
            local_c = resolveAsName(pParse_00,(ExprList *)db_00,(Expr *)in_stack_ffffffffffffff98);
            if (local_c == 0) {
              sqlite3ExprDup(db_00,(Expr *)in_stack_ffffffffffffff98,
                             (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
              if (((psVar3->mallocFailed == '\0') &&
                  (local_c = resolveOrderByTermToExprList
                                       ((Parse *)CONCAT44(iVar6,in_stack_ffffffffffffffb8),
                                        pSelect_00,(Expr *)pParse_00), 1 < in_RDI->eParseMode)) &&
                 (0 < local_c)) {
                resolveOrderByTermToExprList
                          ((Parse *)CONCAT44(iVar6,in_stack_ffffffffffffffb8),pSelect_00,
                           (Expr *)pParse_00);
              }
              sqlite3ExprDelete(in_stack_ffffffffffffff90,
                                (Expr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                ));
            }
            if (local_c < 1) {
              iVar6 = 1;
            }
            else {
              if (in_RDI->eParseMode < 2) {
                in_stack_ffffffffffffff98 =
                     (sqlite3 *)
                     sqlite3Expr(in_stack_ffffffffffffff98,
                                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                 (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88));
                if (in_stack_ffffffffffffff98 == (sqlite3 *)0x0) {
                  local_10 = 1;
                  goto LAB_001dd8ee;
                }
                *(u32 *)((long)&in_stack_ffffffffffffff98->pVfs + 4) =
                     *(u32 *)((long)&in_stack_ffffffffffffff98->pVfs + 4) | 0x800;
                ((anon_union_8_2_443a03b8_for_u *)&in_stack_ffffffffffffff98->pVdbe)->iValue =
                     local_c;
                if (*(Parse **)pSelect_00 == pParse_00) {
                  *(sqlite3 **)pSelect_00 = in_stack_ffffffffffffff98;
                }
                else {
                  in_stack_ffffffffffffff90 = *(sqlite3 **)pSelect_00;
                  while (*(char *)&in_stack_ffffffffffffff90->pDfltColl->zName == 'r') {
                    in_stack_ffffffffffffff90 = (sqlite3 *)in_stack_ffffffffffffff90->pDfltColl;
                  }
                  in_stack_ffffffffffffff90->pDfltColl = (CollSeq *)in_stack_ffffffffffffff98;
                }
                sqlite3ExprDelete(in_stack_ffffffffffffff90,
                                  (Expr *)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
                *(short *)pSelect_00->addrOpenEphm = (short)local_c;
              }
              *(ushort *)((long)&pSelect_00->selId + 1) =
                   *(ushort *)((long)&pSelect_00->selId + 1) & 0xfffb | 4;
            }
          }
          pSelect_00 = (Select *)(pSelect_00->addrOpenEphm + 1);
        }
        local_20 = *(long *)(local_20 + 0x58);
      }
      for (local_24 = 0; local_24 < *piVar2; local_24 = local_24 + 1) {
        if ((*(ushort *)((long)piVar2 + (long)local_24 * 0x18 + 0x19) >> 2 & 1) == 0) {
          sqlite3ErrorMsg(in_RDI,"%r ORDER BY term does not match any column in the result set",
                          (ulong)(local_24 + 1));
          local_10 = 1;
          goto LAB_001dd8ee;
        }
      }
      local_10 = 0;
    }
  }
LAB_001dd8ee:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].fg.done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->fg.done ) continue;
      pE = sqlite3ExprSkipCollateAndLikely(pItem->pExpr);
      if( NEVER(pE==0) ) continue;
      if( sqlite3ExprIsInteger(pE, &iCol, 0) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr, pE);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          /* Now test if expression pE matches one of the values returned
          ** by pSelect. In the usual case this is done by duplicating the
          ** expression, resolving any symbols in it, and then comparing
          ** it against each expression returned by the SELECT statement.
          ** Once the comparisons are finished, the duplicate expression
          ** is deleted.
          **
          ** If this is running as part of an ALTER TABLE operation and
          ** the symbols resolve successfully, also resolve the symbols in the
          ** actual expression. This allows the code in alter.c to modify
          ** column references within the ORDER BY expression as required.  */
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
            if( IN_RENAME_OBJECT && iCol>0 ){
              resolveOrderByTermToExprList(pParse, pSelect, pE);
            }
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists. */
        if( !IN_RENAME_OBJECT ){
          Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
          if( pNew==0 ) return 1;
          pNew->flags |= EP_IntValue;
          pNew->u.iValue = iCol;
          if( pItem->pExpr==pE ){
            pItem->pExpr = pNew;
          }else{
            Expr *pParent = pItem->pExpr;
            assert( pParent->op==TK_COLLATE );
            while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
            assert( pParent->pLeft==pE );
            pParent->pLeft = pNew;
          }
          sqlite3ExprDelete(db, pE);
          pItem->u.x.iOrderByCol = (u16)iCol;
        }
        pItem->fg.done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].fg.done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}